

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GoogleCloudKms.cpp
# Opt level: O0

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::GoogleCloudKms::createKey
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,GoogleCloudKms *this,Path *path,Parameters *parameters)

{
  Client *client;
  string local_88;
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_68;
  Url local_48;
  Parameters *local_28;
  Parameters *parameters_local;
  Path *path_local;
  GoogleCloudKms *this_local;
  
  client = *(Client **)this;
  local_28 = parameters;
  parameters_local = (Parameters *)path;
  path_local = (Path *)this;
  this_local = (GoogleCloudKms *)__return_storage_ptr__;
  Vault::operator+(&local_88,"keys/",path);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Tiny(&local_68,&local_88);
  getUrl(&local_48,this,&local_68);
  HttpConsumer::post(__return_storage_ptr__,client,&local_48,local_28);
  Tiny<Vault::UrlDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_48);
  Tiny<Vault::PathDetail,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Tiny(&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::GoogleCloudKms::createKey(const Path &path,
                                 const Parameters &parameters) {
  return HttpConsumer::post(client_, getUrl(Path{"keys/" + path}), parameters);
}